

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O3

void pugi::impl::anon_unknown_0::destroy_node(xml_node_struct *n,xml_allocator *alloc)

{
  char_t *pcVar1;
  xml_attribute_struct *pxVar2;
  xml_node_struct *pxVar3;
  long lVar4;
  xml_attribute_struct *pxVar5;
  xml_node_struct *n_00;
  ulong uVar6;
  xml_memory_page *in_RCX;
  void *pvVar7;
  
  uVar6 = n->header;
  if ((uVar6 & 0x20) != 0) {
    pcVar1 = n->name;
    in_RCX = (xml_memory_page *)((ulong)*(ushort *)(pcVar1 + -4) * 8);
    lVar4 = (ulong)*(ushort *)(pcVar1 + -4) * -8;
    if (*(ushort *)(pcVar1 + -2) == 0) {
      pvVar7 = *(void **)(pcVar1 + lVar4 + -0x14);
    }
    else {
      pvVar7 = (void *)((ulong)*(ushort *)(pcVar1 + -2) << 3);
    }
    xml_allocator::deallocate_memory(alloc,pvVar7,(size_t)(pcVar1 + lVar4 + -0x2c),in_RCX);
    uVar6 = n->header;
  }
  if ((uVar6 & 0x10) != 0) {
    pcVar1 = n->value;
    in_RCX = (xml_memory_page *)((ulong)*(ushort *)(pcVar1 + -4) * 8);
    lVar4 = (ulong)*(ushort *)(pcVar1 + -4) * -8;
    if (*(ushort *)(pcVar1 + -2) == 0) {
      pvVar7 = *(void **)(pcVar1 + lVar4 + -0x14);
    }
    else {
      pvVar7 = (void *)((ulong)*(ushort *)(pcVar1 + -2) << 3);
    }
    xml_allocator::deallocate_memory(alloc,pvVar7,(size_t)(pcVar1 + lVar4 + -0x2c),in_RCX);
  }
  pxVar5 = n->first_attribute;
  while (pxVar5 != (xml_attribute_struct *)0x0) {
    uVar6 = pxVar5->header;
    pxVar2 = pxVar5->next_attribute;
    if ((uVar6 & 0x20) != 0) {
      pcVar1 = pxVar5->name;
      in_RCX = (xml_memory_page *)((ulong)*(ushort *)(pcVar1 + -4) * 8);
      lVar4 = (ulong)*(ushort *)(pcVar1 + -4) * -8;
      if (*(ushort *)(pcVar1 + -2) == 0) {
        pvVar7 = *(void **)(pcVar1 + lVar4 + -0x14);
      }
      else {
        pvVar7 = (void *)((ulong)*(ushort *)(pcVar1 + -2) << 3);
      }
      xml_allocator::deallocate_memory(alloc,pvVar7,(size_t)(pcVar1 + lVar4 + -0x2c),in_RCX);
      uVar6 = pxVar5->header;
    }
    if ((uVar6 & 0x10) != 0) {
      pcVar1 = pxVar5->value;
      in_RCX = (xml_memory_page *)((ulong)*(ushort *)(pcVar1 + -4) * 8);
      lVar4 = (ulong)*(ushort *)(pcVar1 + -4) * -8;
      if (*(ushort *)(pcVar1 + -2) == 0) {
        pvVar7 = *(void **)(pcVar1 + lVar4 + -0x14);
      }
      else {
        pvVar7 = (void *)((ulong)*(ushort *)(pcVar1 + -2) << 3);
      }
      xml_allocator::deallocate_memory(alloc,pvVar7,(size_t)(pcVar1 + lVar4 + -0x2c),in_RCX);
      uVar6 = pxVar5->header;
    }
    xml_allocator::deallocate_memory(alloc,(void *)0x28,(long)pxVar5 - (uVar6 >> 8),in_RCX);
    pxVar5 = pxVar2;
  }
  n_00 = n->first_child;
  while (n_00 != (xml_node_struct *)0x0) {
    pxVar3 = n_00->next_sibling;
    destroy_node(n_00,alloc);
    n_00 = pxVar3;
  }
  xml_allocator::deallocate_memory(alloc,(void *)0x40,(long)n - (n->header >> 8),in_RCX);
  return;
}

Assistant:

inline void destroy_node(xml_node_struct* n, xml_allocator& alloc)
	{
		if (n->header & impl::xml_memory_page_name_allocated_mask)
			alloc.deallocate_string(n->name);

		if (n->header & impl::xml_memory_page_value_allocated_mask)
			alloc.deallocate_string(n->value);

		for (xml_attribute_struct* attr = n->first_attribute; attr; )
		{
			xml_attribute_struct* next = attr->next_attribute;

			destroy_attribute(attr, alloc);

			attr = next;
		}

		for (xml_node_struct* child = n->first_child; child; )
		{
			xml_node_struct* next = child->next_sibling;

			destroy_node(child, alloc);

			child = next;
		}

		alloc.deallocate_memory(n, sizeof(xml_node_struct), PUGI__GETPAGE(n));
	}